

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ComponentPtr __thiscall
libcellml::Parser::ParserImpl::loadComponentRef
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node,NameList *usedNames)

{
  IssueImpl *pIVar1;
  bool bVar2;
  element_type *peVar3;
  iterator __first;
  iterator __last;
  string *name;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_R8;
  ComponentPtr CVar10;
  shared_ptr<libcellml::XmlNode> local_5b8;
  string local_5a8;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined1 local_4e8 [8];
  IssuePtr issue_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  IssuePtr issue_4;
  string textNode;
  undefined1 local_3f8 [8];
  ComponentPtr childComponent;
  string childEncapsulationId;
  XmlNodePtr childComponentNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  IssuePtr issue_3;
  string local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  IssuePtr issue_2;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  IssuePtr issue_1;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  IssuePtr issue;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  string local_b8;
  undefined1 local_88 [8];
  XmlAttributePtr attribute;
  string encapsulationId;
  string parentComponentName;
  NameList *usedNames_local;
  XmlNodePtr *node_local;
  ModelPtr *model_local;
  ParserImpl *this_local;
  ComponentPtr *parentComponent;
  
  std::shared_ptr<libcellml::Component>::shared_ptr
            ((shared_ptr<libcellml::Component> *)this,(nullptr_t)0x0);
  std::__cxx11::string::string((string *)(encapsulationId.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             usedNames);
  XmlNode::firstAttribute((XmlNode *)local_88);
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_88,(nullptr_t)0x0),
        bVar2) {
    peVar3 = std::
             __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
    bVar2 = XmlAttribute::isType(peVar3,"component","");
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
      XmlAttribute::value_abi_cxx11_(&local_b8,peVar3);
      std::__cxx11::string::operator=
                ((string *)(encapsulationId.field_2._M_local_buf + 8),(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_R8);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_R8);
      local_c0 = std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (__first._M_current,__last._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (encapsulationId.field_2._M_local_buf + 8));
      issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_R8);
      bVar2 = __gnu_cxx::operator==
                        (&local_c0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      if (bVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  (in_R8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&encapsulationId.field_2 + 8));
      }
      else {
        Issue::IssueImpl::create();
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        pIVar1 = peVar6->mPimpl;
        peVar7 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        NamedEntity::name_abi_cxx11_(&local_188,(NamedEntity *)peVar7);
        std::operator+(&local_168,"Encapsulation in model \'",&local_188);
        std::operator+(&local_148,&local_168,"\' specifies \'");
        std::operator+(&local_128,&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&encapsulationId.field_2 + 8));
        std::operator+(&local_108,&local_128,
                       "\' as a component in a component_ref but it is not unique.");
        Issue::IssueImpl::setDescription(pIVar1,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        peVar8 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar6->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar8->mPimpl,(ModelPtr *)node);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_e8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_e8);
      }
      peVar7 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
      bVar2 = ComponentEntity::containsComponent
                        (&peVar7->super_ComponentEntity,
                         (string *)((long)&encapsulationId.field_2 + 8),true);
      if (bVar2) {
        name = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        ComponentEntity::takeComponent
                  ((ComponentEntity *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,name,(bool)((char)&encapsulationId + '\x18'));
        std::shared_ptr<libcellml::Component>::operator=
                  ((shared_ptr<libcellml::Component> *)this,
                   (shared_ptr<libcellml::Component> *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        Issue::IssueImpl::create();
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1a8);
        pIVar1 = peVar6->mPimpl;
        peVar7 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        NamedEntity::name_abi_cxx11_(&local_248,(NamedEntity *)peVar7);
        std::operator+(&local_228,"Encapsulation in model \'",&local_248);
        std::operator+(&local_208,&local_228,"\' specifies \'");
        std::operator+(&local_1e8,&local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&encapsulationId.field_2 + 8));
        std::operator+(&local_1c8,&local_1e8,
                       "\' as a component in a component_ref but it does not exist in the model.");
        Issue::IssueImpl::setDescription(pIVar1,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1a8);
        peVar8 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar6->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar8->mPimpl,(ModelPtr *)node);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1a8);
        Issue::IssueImpl::setReferenceRule
                  (peVar6->mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_1a8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_1a8);
      }
    }
    else {
      bVar2 = isIdAttribute((XmlAttributePtr *)local_88,
                            (bool)(*(byte *)&model[6].
                                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi & 1));
      if (bVar2) {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
        XmlAttribute::value_abi_cxx11_
                  ((string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar3);
        std::__cxx11::string::operator=
                  ((string *)
                   &attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        Issue::IssueImpl::create();
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_278);
        pIVar1 = peVar6->mPimpl;
        peVar7 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        NamedEntity::name_abi_cxx11_(&local_318,(NamedEntity *)peVar7);
        std::operator+(&local_2f8,"Encapsulation in model \'",&local_318);
        std::operator+(&local_2d8,&local_2f8,"\' has an invalid component_ref attribute \'");
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
        XmlAttribute::name_abi_cxx11_(&local_338,peVar3);
        std::operator+(&local_2b8,&local_2d8,&local_338);
        std::operator+(&local_298,&local_2b8,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_278);
        peVar8 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar6->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar8->mPimpl,(ModelPtr *)node);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_278);
        Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,COMPONENT_REF_ELEMENT);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_278);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_278);
      }
    }
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_88);
    XmlAttribute::next((XmlAttribute *)
                       &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)local_88,
               (shared_ptr<libcellml::XmlAttribute> *)
               &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if ((bVar2) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar2) {
      peVar9 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      ComponentEntity::setEncapsulationId
                (&peVar9->super_ComponentEntity,
                 (string *)
                 &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    Issue::IssueImpl::create();
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_358);
    pIVar1 = peVar6->mPimpl;
    peVar7 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)node);
    NamedEntity::name_abi_cxx11_
              ((string *)
               &childComponentNode.
                super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (NamedEntity *)peVar7);
    std::operator+(&local_398,"Encapsulation in model \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &childComponentNode.
                    super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::operator+(&local_378,&local_398,
                   "\' does not have a valid component attribute in a component_ref element.");
    Issue::IssueImpl::setDescription(pIVar1,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string
              ((string *)
               &childComponentNode.
                super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_358);
    peVar8 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar8->mPimpl,(ModelPtr *)node);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_358);
    Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE);
    Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_358);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_358);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             usedNames);
  XmlNode::firstChild((XmlNode *)((long)&childEncapsulationId.field_2 + 8));
  std::__cxx11::string::string
            ((string *)
             &childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  while (bVar2 = std::__shared_ptr::operator_cast_to_bool
                           ((__shared_ptr *)(childEncapsulationId.field_2._M_local_buf + 8)), bVar2)
  {
    std::shared_ptr<libcellml::Component>::shared_ptr
              ((shared_ptr<libcellml::Component> *)local_3f8,(nullptr_t)0x0);
    bVar2 = parseNode((ParserImpl *)model,(XmlNodePtr *)((long)&childEncapsulationId.field_2 + 8),
                      "component_ref");
    if (bVar2) {
      loadComponentRef((ParserImpl *)((long)&textNode.field_2 + 8),model,node,
                       (NameList *)((long)&childEncapsulationId.field_2 + 8));
      std::shared_ptr<libcellml::Component>::operator=
                ((shared_ptr<libcellml::Component> *)local_3f8,
                 (shared_ptr<libcellml::Component> *)((long)&textNode.field_2 + 8));
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)((long)&textNode.field_2 + 8));
    }
    else {
      peVar5 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(childEncapsulationId.field_2._M_local_buf + 8));
      bVar2 = XmlNode::isText(peVar5);
      if (bVar2) {
        peVar5 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(childEncapsulationId.field_2._M_local_buf + 8));
        XmlNode::convertToString_abi_cxx11_
                  ((string *)
                   &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar5);
        bVar2 = hasNonWhitespaceCharacters
                          ((string *)
                           &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        if (bVar2) {
          Issue::IssueImpl::create();
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_438);
          pIVar1 = peVar6->mPimpl;
          peVar7 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)node);
          NamedEntity::name_abi_cxx11_
                    ((string *)
                     &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(NamedEntity *)peVar7);
          std::operator+(&local_4b8,"Encapsulation in model \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_498,&local_4b8,
                         "\' has an invalid non-whitespace child text element \'");
          std::operator+(&local_478,&local_498,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_458,&local_478,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_458);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string
                    ((string *)
                     &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_438);
          peVar8 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar8->mPimpl,(ModelPtr *)node);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_438);
          Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_438);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_438);
        }
        std::__cxx11::string::~string
                  ((string *)
                   &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(childEncapsulationId.field_2._M_local_buf + 8));
        bVar2 = XmlNode::isComment(peVar5);
        if (!bVar2) {
          Issue::IssueImpl::create();
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_4e8);
          pIVar1 = peVar6->mPimpl;
          peVar7 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)node);
          NamedEntity::name_abi_cxx11_(&local_588,(NamedEntity *)peVar7);
          std::operator+(&local_568,"Encapsulation in model \'",&local_588);
          std::operator+(&local_548,&local_568,"\' has an invalid child element \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(childEncapsulationId.field_2._M_local_buf + 8));
          XmlNode::name_abi_cxx11_(&local_5a8,peVar5);
          std::operator+(&local_528,&local_548,&local_5a8);
          std::operator+(&local_508,&local_528,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_508);
          std::__cxx11::string::~string((string *)&local_508);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_588);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_4e8);
          peVar8 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation(peVar8->mPimpl,(ModelPtr *)node);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_4e8);
          Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,COMPONENT_REF_CHILD);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_4e8);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_4e8);
        }
      }
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3f8);
    if (bVar2) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
      if (bVar2) {
        peVar9 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        ComponentEntity::addComponent(&peVar9->super_ComponentEntity,(ComponentPtr *)local_3f8);
      }
      else {
        peVar7 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        ComponentEntity::addComponent(&peVar7->super_ComponentEntity,(ComponentPtr *)local_3f8);
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               (childEncapsulationId.field_2._M_local_buf + 8));
    XmlNode::next((XmlNode *)&local_5b8);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)((long)&childEncapsulationId.field_2 + 8),
               &local_5b8);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_5b8);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)local_3f8);
  }
  std::__cxx11::string::~string
            ((string *)
             &childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)((long)&childEncapsulationId.field_2 + 8));
  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)local_88);
  std::__cxx11::string::~string
            ((string *)
             &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)(encapsulationId.field_2._M_local_buf + 8));
  CVar10.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar10.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar10.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr Parser::ParserImpl::loadComponentRef(const ModelPtr &model, const XmlNodePtr &node, NameList &usedNames)
{
    ComponentPtr parentComponent = nullptr;
    std::string parentComponentName;
    std::string encapsulationId;
    // Check for a component in the parent component_ref.
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("component")) {
            parentComponentName = attribute->value();

            if (std::find(usedNames.begin(), usedNames.end(), parentComponentName) == usedNames.end()) {
                usedNames.emplace_back(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it is not unique.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
                addIssue(issue);
            }

            if (model->containsComponent(parentComponentName)) {
                // Will re-add this to the model once we encapsulate the child(ren).
                parentComponent = model->takeComponent(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it does not exist in the model.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            encapsulationId = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid component_ref attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }
    if (!parentComponent && parentComponentName.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not have a valid component attribute in a component_ref element.");
        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE);
        addIssue(issue);
    } else if (parentComponent) {
        parentComponent->setEncapsulationId(encapsulationId);
    }

    // Get first child of this parent component_ref.
    XmlNodePtr childComponentNode = node->firstChild();

    // Loop over encapsulated children.
    std::string childEncapsulationId;
    while (childComponentNode) {
        ComponentPtr childComponent = nullptr;
        if (parseNode(childComponentNode, "component_ref")) {
            childComponent = loadComponentRef(model, childComponentNode, usedNames);
        } else if (childComponentNode->isText()) {
            const std::string textNode = childComponentNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childComponentNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + childComponentNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_CHILD);
            addIssue(issue);
        }

        if (childComponent) {
            // Set parent/child encapsulation relationship.
            if (parentComponent) {
                parentComponent->addComponent(childComponent);
            } else {
                // Making sure that children which were taken from parents above, but have
                // invalid parents, are still included in the model.
                model->addComponent(childComponent);
            }
        }
        childComponentNode = childComponentNode->next();
    }

    return parentComponent;
}